

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<int>>
          (QtPrivate *this,QDebug debug,char *which,QList<int> *c)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  QDebug *this_00;
  QDebug this_01;
  int *piVar5;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  this_00 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(this_00,'(');
  piVar5 = (c->d).ptr;
  lVar3 = (c->d).size;
  piVar1 = piVar5 + lVar3;
  this_01.stream = debug.stream;
  if (lVar3 == 0) goto LAB_003ba4ab;
  while( true ) {
    QDebug::operator<<((QDebug *)this_01.stream,*piVar5);
    piVar5 = piVar5 + 1;
LAB_003ba4ab:
    if (piVar5 == piVar1) break;
    this_01.stream = (Stream *)QDebug::operator<<(debug.stream,", ");
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar4 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar4;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}